

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O2

void rapidjson::internal::DigitGen(DiyFp *W,DiyFp *Mp,uint64_t delta,char *buffer,int *len,int *K)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint64_t wp_w;
  ulong rest;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint64_t ten_kappa;
  uint64_t uVar8;
  char cVar9;
  ulong uVar10;
  ulong uStack_60;
  
  bVar4 = -(char)Mp->e;
  ten_kappa = 1L << (bVar4 & 0x3f);
  uVar10 = Mp->f;
  wp_w = uVar10 - W->f;
  uVar5 = ten_kappa - 1 & uVar10;
  uVar10 = uVar10 >> (bVar4 & 0x3f);
  uVar1 = CountDecimalDigit32((uint32_t)uVar10);
  uVar7 = (ulong)uVar1;
  *len = 0;
  do {
    iVar2 = (int)uVar10;
    if ((int)uVar7 < 1) {
      uVar1 = -((int)uVar1 >> 0x1f & uVar1);
      rest = uVar5;
      do {
        cVar9 = (char)(rest * 10 >> (bVar4 & 0x3f));
        iVar2 = *len;
        if (cVar9 != '\0' || iVar2 != 0) {
          *len = iVar2 + 1;
          buffer[iVar2] = cVar9 + '0';
        }
        delta = delta * 10;
        rest = rest * 10 & ten_kappa - 1;
        uVar1 = uVar1 + 1;
      } while (delta <= rest);
      *K = *K - uVar1;
      iVar2 = *len;
      if ((int)(1 - uVar1) < -0x12) {
        uVar8 = 0;
      }
      else {
        uVar8 = DigitGen::kPow10[uVar1];
      }
      wp_w = uVar8 * wp_w;
      goto LAB_00106792;
    }
    uVar6 = (int)uVar7 - 1;
    uVar7 = (ulong)uVar6;
    switch(uVar7) {
    case 0:
      uStack_60 = 0;
      goto LAB_00106688;
    case 1:
      uStack_60 = 10;
      break;
    case 2:
      uStack_60 = 100;
      break;
    case 3:
      uStack_60 = 1000;
      break;
    case 4:
      uStack_60 = 10000;
      break;
    case 5:
      uStack_60 = 100000;
      break;
    case 6:
      iVar2 = (int)((uVar10 & 0xffffffff) / 1000000);
      uStack_60 = (uVar10 & 0xffffffff) % 1000000;
      goto LAB_00106688;
    case 7:
      iVar2 = (int)((uVar10 & 0xffffffff) / 10000000);
      uStack_60 = (uVar10 & 0xffffffff) % 10000000;
      goto LAB_00106688;
    case 8:
      iVar2 = (int)((uVar10 & 0xffffffff) / 100000000);
      uStack_60 = (uVar10 & 0xffffffff) % 100000000;
      goto LAB_00106688;
    default:
      iVar3 = *len;
      uStack_60 = uVar10 & 0xffffffff;
      goto LAB_001066ba;
    }
    iVar2 = (int)((uVar10 & 0xffffffff) / uStack_60);
    uStack_60 = (uVar10 & 0xffffffff) % uStack_60;
LAB_00106688:
    iVar3 = *len;
    uVar10 = uStack_60;
    if (iVar2 == 0) {
LAB_001066ba:
      cVar9 = '0';
      if (iVar3 != 0) goto LAB_001066c0;
    }
    else {
      cVar9 = (char)iVar2 + '0';
LAB_001066c0:
      *len = iVar3 + 1;
      buffer[iVar3] = cVar9;
      uVar10 = uStack_60;
    }
    rest = ((uVar10 & 0xffffffff) << (bVar4 & 0x3f)) + uVar5;
    if (rest <= delta) {
      *K = *K + uVar6;
      ten_kappa = DigitGen::kPow10[uVar7] << (bVar4 & 0x3f);
      iVar2 = *len;
LAB_00106792:
      GrisuRound(buffer,iVar2,delta,rest,ten_kappa,wp_w);
      return;
    }
  } while( true );
}

Assistant:

inline void DigitGen(const DiyFp& W, const DiyFp& Mp, uint64_t delta, char* buffer, int* len, int* K) {
    static const uint64_t kPow10[] = { 1U, 10U, 100U, 1000U, 10000U, 100000U, 1000000U, 10000000U, 100000000U,
                                       1000000000U, 10000000000U, 100000000000U, 1000000000000U,
                                       10000000000000U, 100000000000000U, 1000000000000000U,
                                       10000000000000000U, 100000000000000000U, 1000000000000000000U,
                                       10000000000000000000U };
    const DiyFp one(uint64_t(1) << -Mp.e, Mp.e);
    const DiyFp wp_w = Mp - W;
    uint32_t p1 = static_cast<uint32_t>(Mp.f >> -one.e);
    uint64_t p2 = Mp.f & (one.f - 1);
    int kappa = CountDecimalDigit32(p1); // kappa in [0, 9]
    *len = 0;

    while (kappa > 0) {
        uint32_t d = 0;
        switch (kappa) {
            case  9: d = p1 /  100000000; p1 %=  100000000; break;
            case  8: d = p1 /   10000000; p1 %=   10000000; break;
            case  7: d = p1 /    1000000; p1 %=    1000000; break;
            case  6: d = p1 /     100000; p1 %=     100000; break;
            case  5: d = p1 /      10000; p1 %=      10000; break;
            case  4: d = p1 /       1000; p1 %=       1000; break;
            case  3: d = p1 /        100; p1 %=        100; break;
            case  2: d = p1 /         10; p1 %=         10; break;
            case  1: d = p1;              p1 =           0; break;
            default:;
        }
        if (d || *len)
            buffer[(*len)++] = static_cast<char>('0' + static_cast<char>(d));
        kappa--;
        uint64_t tmp = (static_cast<uint64_t>(p1) << -one.e) + p2;
        if (tmp <= delta) {
            *K += kappa;
            GrisuRound(buffer, *len, delta, tmp, kPow10[kappa] << -one.e, wp_w.f);
            return;
        }
    }

    // kappa = 0
    for (;;) {
        p2 *= 10;
        delta *= 10;
        char d = static_cast<char>(p2 >> -one.e);
        if (d || *len)
            buffer[(*len)++] = static_cast<char>('0' + d);
        p2 &= one.f - 1;
        kappa--;
        if (p2 < delta) {
            *K += kappa;
            int index = -kappa;
            GrisuRound(buffer, *len, delta, p2, one.f, wp_w.f * (index < 20 ? kPow10[index] : 0));
            return;
        }
    }
}